

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

TraceStats * __thiscall
perfetto::TracingServiceImpl::GetTraceStats
          (TraceStats *__return_storage_ptr__,TracingServiceImpl *this,
          TracingSession *tracing_session)

{
  BufferID *pBVar1;
  TraceStats_FilterStats *this_00;
  TraceBuffer *pTVar2;
  TraceStats_BufferStats *this_01;
  BufferID *pBVar3;
  
  protos::gen::TraceStats::TraceStats(__return_storage_ptr__);
  protos::gen::TraceStats::set_producers_connected
            (__return_storage_ptr__,
             (uint32_t)(this->producers_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  protos::gen::TraceStats::set_producers_seen(__return_storage_ptr__,(ulong)this->last_producer_id_)
  ;
  protos::gen::TraceStats::set_data_sources_registered
            (__return_storage_ptr__,
             (uint32_t)(this->data_sources_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  protos::gen::TraceStats::set_data_sources_seen
            (__return_storage_ptr__,this->last_data_source_instance_id_);
  protos::gen::TraceStats::set_tracing_sessions
            (__return_storage_ptr__,
             (uint32_t)(this->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  protos::gen::TraceStats::set_total_buffers
            (__return_storage_ptr__,
             (uint32_t)(this->buffers_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  protos::gen::TraceStats::set_chunks_discarded(__return_storage_ptr__,this->chunks_discarded_);
  protos::gen::TraceStats::set_patches_discarded(__return_storage_ptr__,this->patches_discarded_);
  protos::gen::TraceStats::set_invalid_packets
            (__return_storage_ptr__,tracing_session->invalid_packets);
  protos::gen::TraceStats::set_flushes_requested
            (__return_storage_ptr__,tracing_session->flushes_requested);
  protos::gen::TraceStats::set_flushes_succeeded
            (__return_storage_ptr__,tracing_session->flushes_succeeded);
  protos::gen::TraceStats::set_flushes_failed
            (__return_storage_ptr__,tracing_session->flushes_failed);
  protos::gen::TraceStats::set_final_flush_outcome
            (__return_storage_ptr__,tracing_session->final_flush_outcome);
  if ((tracing_session->trace_filter)._M_t.
      super___uniq_ptr_impl<protozero::MessageFilter,_std::default_delete<protozero::MessageFilter>_>
      ._M_t.
      super__Tuple_impl<0UL,_protozero::MessageFilter_*,_std::default_delete<protozero::MessageFilter>_>
      .super__Head_base<0UL,_protozero::MessageFilter_*,_false>._M_head_impl != (MessageFilter *)0x0
     ) {
    this_00 = protos::gen::TraceStats::mutable_filter_stats(__return_storage_ptr__);
    protos::gen::TraceStats_FilterStats::set_input_packets
              (this_00,tracing_session->filter_input_packets);
    protos::gen::TraceStats_FilterStats::set_input_bytes
              (this_00,tracing_session->filter_input_bytes);
    protos::gen::TraceStats_FilterStats::set_output_bytes
              (this_00,tracing_session->filter_output_bytes);
    protos::gen::TraceStats_FilterStats::set_errors(this_00,tracing_session->filter_errors);
  }
  pBVar1 = (tracing_session->buffers_index).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar3 = (tracing_session->buffers_index).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar3 != pBVar1; pBVar3 = pBVar3 + 1) {
    pTVar2 = GetBufferByID(this,*pBVar3);
    if (pTVar2 != (TraceBuffer *)0x0) {
      this_01 = protos::gen::TraceStats::add_buffer_stats(__return_storage_ptr__);
      protos::gen::TraceStats_BufferStats::operator=(this_01,&pTVar2->stats_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TraceStats TracingServiceImpl::GetTraceStats(TracingSession* tracing_session) {
  TraceStats trace_stats;
  trace_stats.set_producers_connected(static_cast<uint32_t>(producers_.size()));
  trace_stats.set_producers_seen(last_producer_id_);
  trace_stats.set_data_sources_registered(
      static_cast<uint32_t>(data_sources_.size()));
  trace_stats.set_data_sources_seen(last_data_source_instance_id_);
  trace_stats.set_tracing_sessions(
      static_cast<uint32_t>(tracing_sessions_.size()));
  trace_stats.set_total_buffers(static_cast<uint32_t>(buffers_.size()));
  trace_stats.set_chunks_discarded(chunks_discarded_);
  trace_stats.set_patches_discarded(patches_discarded_);
  trace_stats.set_invalid_packets(tracing_session->invalid_packets);
  trace_stats.set_flushes_requested(tracing_session->flushes_requested);
  trace_stats.set_flushes_succeeded(tracing_session->flushes_succeeded);
  trace_stats.set_flushes_failed(tracing_session->flushes_failed);
  trace_stats.set_final_flush_outcome(tracing_session->final_flush_outcome);

  if (tracing_session->trace_filter) {
    auto* filt_stats = trace_stats.mutable_filter_stats();
    filt_stats->set_input_packets(tracing_session->filter_input_packets);
    filt_stats->set_input_bytes(tracing_session->filter_input_bytes);
    filt_stats->set_output_bytes(tracing_session->filter_output_bytes);
    filt_stats->set_errors(tracing_session->filter_errors);
  }

  for (BufferID buf_id : tracing_session->buffers_index) {
    TraceBuffer* buf = GetBufferByID(buf_id);
    if (!buf) {
      PERFETTO_DFATAL("Buffer not found.");
      continue;
    }
    *trace_stats.add_buffer_stats() = buf->stats();
  }  // for (buf in session).
  return trace_stats;
}